

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O0

line_data_t *
kiste::parse_text_line(line_data_t *__return_storage_ptr__,parse_context *ctx,string *line)

{
  ulong uVar1;
  parse_error *this;
  ulong uVar2;
  char *pcVar3;
  segment_t local_80;
  ulong local_50;
  size_t pos;
  pointer psStack_40;
  pointer local_38;
  undefined1 local_2d;
  string *local_20;
  string *line_local;
  parse_context *ctx_local;
  line_data_t *text_line;
  
  local_20 = line;
  line_local = (string *)ctx;
  ctx_local = (parse_context *)__return_storage_ptr__;
  if (ctx->_class_curly_level < ctx->_curly_level) {
    local_2d = 0;
    pos = 0;
    psStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector
              ((vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)&pos);
    line_data_t::line_data_t
              (__return_storage_ptr__,text,
               (vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)&pos);
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::~vector
              ((vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)&pos);
    for (local_50 = 0; uVar1 = local_50, uVar2 = std::__cxx11::string::size(), uVar1 < uVar2;
        local_50 = local_50 + 1) {
      pcVar3 = (char *)std::__cxx11::string::at((ulong)local_20);
      if (*pcVar3 == '$') {
        local_50 = local_50 + 1;
        parse_command(&local_80,local_20,local_50);
        local_50 = line_data_t::add_segment(__return_storage_ptr__,&local_80);
        segment_t::~segment_t(&local_80);
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::at((ulong)local_20);
        line_data_t::add_character(__return_storage_ptr__,*pcVar3);
      }
    }
    return __return_storage_ptr__;
  }
  this = (parse_error *)__cxa_allocate_exception(0x10);
  parse_error::parse_error(this,"Unexpected text outside of member function");
  __cxa_throw(this,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

auto parse_text_line(const parse_context& ctx, const std::string& line) -> line_data_t
  {
    if (ctx._curly_level <= ctx._class_curly_level)
      throw parse_error("Unexpected text outside of member function");

    auto text_line = line_data_t{line_type::text, {}};
    for (std::size_t pos = 0; pos < line.size(); ++pos)
    {
      switch (line.at(pos))
      {
      case '$':
      {
        pos = text_line.add_segment(parse_command(line, ++pos));
        break;
      }
      default:
        text_line.add_character(line.at(pos));
        break;
      }
    }

    return text_line;
  }